

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void __thiscall
PosixRunWriter::write_raw(PosixRunWriter *this,FileId base,uint8_t *start,uint8_t *end)

{
  FileId FVar1;
  size_type sVar2;
  byte *in_RCX;
  byte *__n;
  byte *in_RDX;
  void *__buf;
  int in_ESI;
  PosixRunWriter *in_RDI;
  uint8_t *ptr;
  uint32_t shift;
  uint64_t acc;
  uint64_t next;
  byte *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte *local_18;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RCX != in_RDX) {
    __n = in_RCX;
    local_18 = in_RDX;
    FVar1 = decompress_single(&local_18);
    write(in_RDI,in_ESI + FVar1,__buf,(size_t)__n);
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    iVar3 = 0;
    for (local_40 = local_18; local_40 < in_RCX; local_40 = local_40 + 1) {
      in_RDI->out_bytes_ = in_RDI->out_bytes_ + 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (this_00,(value_type_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&in_RDI->buffer_);
      if (0x8000000 < sVar2) {
        flush((PosixRunWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      }
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)&(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start +
                (ulong)((*local_40 & 0x7f) << ((byte)iVar3 & 0x1f)));
      iVar3 = iVar3 + 7;
      if ((*local_40 & 0x80) == 0) {
        in_RDI->prev_ =
             (long)&(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + in_RDI->prev_ + 1;
        this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
        iVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void PosixRunWriter::write_raw(FileId base, uint8_t *start,
                               const uint8_t *end) {
    // Special case: when the range is empty, do nothing.
    if (end == start) {
        return;
    }
    // Decompress the first element and write it.
    uint64_t next = decompress_single(&start);
    write(base + next);

    // Write all the other bytes unchanged, and compute the new last element.
    uint64_t acc = 0;
    uint32_t shift = 0;
    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        out_bytes_++;
        buffer_.push_back(*ptr);
        if (buffer_.size() > RUN_BUFFER_SIZE) {
            flush();
        }
        acc += (*ptr & 0x7FU) << shift;
        shift += 7U;
        if ((*ptr & 0x80U) == 0) {
            prev_ += acc + 1;
            acc = 0;
            shift = 0;
        }
    }
}